

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O1

void __thiscall duckdb::BuiltinFunctions::RegisterExtensionOverloads(BuiltinFunctions *this)

{
  char *params;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pVVar4;
  undefined8 uVar5;
  LogicalType varargs;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  LogicalType *other;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar8;
  size_t sVar9;
  reference pvVar10;
  vector<duckdb::Value,_true> *pvVar11;
  InternalException *this_01;
  long lVar12;
  bind_scalar_function_t *pp_Var13;
  bind_scalar_function_t *pp_Var14;
  ScalarFunctionInfo *__tmp;
  pointer this_02;
  byte bVar15;
  vector<duckdb::LogicalType,_true> arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  LogicalType return_type;
  Value parameters;
  ScalarFunction function;
  undefined4 in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad4;
  undefined **ppuVar16;
  undefined **bind_lambda;
  ScalarFunctionSet local_510;
  LogicalType local_4d8;
  BuiltinFunctions *local_4b8;
  _Any_data *local_4b0;
  _Any_data *local_4a8;
  LogicalType *local_4a0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_498;
  element_type *local_480;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_478;
  element_type local_470 [2];
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> local_460;
  bind_scalar_function_t *local_448;
  bind_scalar_function_t *local_440;
  LogicalType *local_438;
  long local_430;
  string local_428;
  string local_408;
  _Any_data local_3e8;
  code *local_3d8;
  undefined8 uStack_3d0;
  string local_3c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_390;
  ScalarFunctionSet local_378;
  LogicalType local_340;
  undefined1 *local_328 [2];
  undefined1 local_318 [48];
  LogicalType local_2e8;
  ScalarFunctionSet local_2d0;
  ScalarFunction local_298;
  LogicalType local_170;
  ScalarFunction local_158;
  
  bVar15 = 0;
  local_4b8 = this;
  ScalarFunctionSet::ScalarFunctionSet(&local_510);
  local_4a0 = &local_158.super_BaseScalarFunction.return_type;
  local_438 = &local_298.super_BaseScalarFunction.return_type;
  local_4a8 = (_Any_data *)&local_158.function;
  local_4b0 = (_Any_data *)&local_298.function;
  local_448 = &local_158.bind;
  local_440 = &local_298.bind;
  ppuVar16 = &PTR__BaseScalarFunction_0248aa80;
  bind_lambda = &PTR__ScalarFunction_0247e7f0;
  lVar12 = 0;
  do {
    params = &EXTENSION_FUNCTION_OVERLOADS + lVar12;
    local_498.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_498.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_498.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)
         &local_298.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
          _M_string_length;
    local_430 = lVar12;
    sVar9 = strlen("[TIMESTAMP]>INTERVAL" + lVar12);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"[TIMESTAMP]>INTERVAL" + lVar12,params + sVar9 + 0x61);
    local_328[0] = local_318;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_328,">","");
    StringUtil::Split(&local_390,(string *)&local_298,(string *)local_328);
    if (local_328[0] != local_318) {
      operator_delete(local_328[0]);
    }
    if (local_298.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
        (_func_int **)
        &local_298.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
         _M_string_length) {
      operator_delete(local_298.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                      _vptr_Function);
    }
    pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[](&local_390,1);
    DBConfig::ParseLogicalType(&local_340,pvVar10);
    pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[](&local_390,0);
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    pcVar3 = (pvVar10->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_408,pcVar3,pcVar3 + pvVar10->_M_string_length);
    Value::Value((Value *)&local_298,&local_408);
    LogicalType::LogicalType(&local_4d8,VARCHAR);
    LogicalType::LIST((LogicalType *)&local_480,&local_4d8);
    Value::DefaultCastAs((Value *)local_328,(Value *)&local_298,(LogicalType *)&local_480,false);
    LogicalType::~LogicalType((LogicalType *)&local_480);
    LogicalType::~LogicalType(&local_4d8);
    Value::~Value((Value *)&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    pvVar11 = ListValue::GetChildren((Value *)local_328);
    pVVar4 = (pvVar11->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_02 = (pvVar11->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_start; this_02 != pVVar4; this_02 = this_02 + 1) {
      Value::GetValue<std::__cxx11::string>((string *)&local_298,this_02);
      DBConfig::ParseLogicalType((LogicalType *)&local_480,(string *)&local_298);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
      emplace_back<duckdb::LogicalType>(&local_498,(LogicalType *)&local_480);
      LogicalType::~LogicalType((LogicalType *)&local_480);
      if (local_298.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
          (_func_int **)
          &local_298.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
           _M_string_length) {
        operator_delete(local_298.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                        _vptr_Function);
      }
    }
    if ((&DAT_01de8f30)[lVar12] != '\x1a') {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_298.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)
           &local_298.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
            _M_string_length;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_298,
                 "Extension function overloads only supported for scalar functions currently - %s has a different type"
                 ,"");
      InternalException::InternalException<char_const*>(this_01,(string *)&local_298,params);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    sVar9 = strlen(params);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,params,params + sVar9);
    local_3a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_498.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_3a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_498.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_3a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_498.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_498.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_498.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_498.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogicalType::LogicalType(&local_2e8,&local_340);
    local_3d8 = (code *)0x0;
    uStack_3d0 = 0;
    local_3e8._M_unused._M_object = (void *)0x0;
    local_3e8._8_8_ = 0;
    LogicalType::LogicalType(&local_170,INVALID);
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    varargs._0_8_ = &local_170;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
         in_stack_fffffffffffffacc;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         0;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         in_stack_fffffffffffffad4;
    ScalarFunction::ScalarFunction
              (&local_298,&local_428,(vector<duckdb::LogicalType,_true> *)&local_3a8,&local_2e8,
               (scalar_function_t *)&local_3e8,BindExtensionFunction,
               (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
               (init_local_state_t)0x0,varargs,CONSISTENT,(FunctionNullHandling)ppuVar16,
               (bind_lambda_function_t)bind_lambda);
    LogicalType::~LogicalType(&local_170);
    if (local_3d8 != (code *)0x0) {
      (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
    }
    LogicalType::~LogicalType(&local_2e8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p);
    }
    local_480 = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::ExtensionFunctionInfo,std::allocator<duckdb::ExtensionFunctionInfo>,char_const(&)[48]>
              (&local_478,(ExtensionFunctionInfo **)&local_480,
               (allocator<duckdb::ExtensionFunctionInfo> *)&local_4d8,
               (char (*) [48])("core_functions" + lVar12));
    _Var7._M_pi = local_478._M_pi;
    peVar6 = local_480;
    if ((element_type *)local_478._M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_478._M_pi)->_M_use_count = (local_478._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_478._M_pi)->_M_use_count = (local_478._M_pi)->_M_use_count + 1;
      }
    }
    if ((element_type *)local_478._M_pi != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478._M_pi);
    }
    this_00._M_pi =
         local_298.function_info.internal.
         super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    local_298.function_info.internal.
    super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
    local_298.function_info.internal.
    super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var7._M_pi;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    iVar8 = ::std::__cxx11::string::compare((char *)&local_510);
    other = local_438;
    if (iVar8 != 0) {
      if (local_510.super_FunctionSet<duckdb::ScalarFunction>.name._M_string_length != 0) {
        local_378.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p =
             (pointer)&local_378.super_FunctionSet<duckdb::ScalarFunction>.name.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_378,
                   local_510.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p,
                   local_510.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p +
                   local_510.super_FunctionSet<duckdb::ScalarFunction>.name._M_string_length);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::vector
                  (&local_378.super_FunctionSet<duckdb::ScalarFunction>.functions.
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
        AddExtensionFunction(local_4b8,&local_378);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
                  (&local_378.super_FunctionSet<duckdb::ScalarFunction>.functions.
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p !=
            &local_378.super_FunctionSet<duckdb::ScalarFunction>.name.field_2) {
          operator_delete(local_378.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p)
          ;
        }
      }
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
      sVar9 = strlen(params);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,params,params + sVar9);
      ScalarFunctionSet::ScalarFunctionSet((ScalarFunctionSet *)&local_480,&local_3c8);
      ::std::__cxx11::string::operator=((string *)&local_510,(string *)&local_480);
      local_4d8.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_4d8.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_4d8._0_8_ =
           local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
      super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
      super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_460.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
      super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
      super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_460.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
      super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
      super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_460.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_460.super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_460.super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_460.super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
                ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                 &local_4d8);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
                (&local_460);
      if (local_480 != local_470) {
        operator_delete(local_480);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
    }
    SimpleFunction::SimpleFunction((SimpleFunction *)&local_158,(SimpleFunction *)&local_298);
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)ppuVar16;
    LogicalType::LogicalType(local_4a0,other);
    local_158.super_BaseScalarFunction.stability = local_298.super_BaseScalarFunction.stability;
    local_158.super_BaseScalarFunction.null_handling =
         local_298.super_BaseScalarFunction.null_handling;
    local_158.super_BaseScalarFunction.errors = local_298.super_BaseScalarFunction.errors;
    local_158.super_BaseScalarFunction.collation_handling =
         local_298.super_BaseScalarFunction.collation_handling;
    *(undefined8 *)local_4a8 = 0;
    *(undefined8 *)((long)local_4a8 + 8) = 0;
    *(_Manager_type *)(local_4a8 + 1) = (_Manager_type)0x0;
    local_158.function._M_invoker = local_298.function._M_invoker;
    if (local_298.function.super__Function_base._M_manager != (_Manager_type)0x0) {
      uVar5 = *(undefined8 *)((long)local_4b0 + 8);
      *(undefined8 *)local_4a8 = *(undefined8 *)local_4b0;
      *(undefined8 *)((long)local_4a8 + 8) = uVar5;
      local_158.function.super__Function_base._M_manager =
           local_298.function.super__Function_base._M_manager;
      local_298.function.super__Function_base._M_manager = (_Manager_type)0x0;
      local_298.function._M_invoker = (_Invoker_type)0x0;
    }
    pp_Var13 = local_440;
    pp_Var14 = local_448;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      *pp_Var14 = *pp_Var13;
      pp_Var13 = pp_Var13 + (ulong)bVar15 * -2 + 1;
      pp_Var14 = pp_Var14 + (ulong)bVar15 * -2 + 1;
    }
    local_158.function_info.internal.
    super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_298.function_info.internal.
         super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_158.function_info.internal.
    super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_298.function_info.internal.
         super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    local_298.function_info.internal.
    super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_298.function_info.internal.
    super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)bind_lambda;
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
    emplace_back<duckdb::ScalarFunction>
              (&local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
               &local_158);
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)bind_lambda;
    if (local_158.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.function_info.internal.
                 super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_158.function.super__Function_base._M_manager)(local_4a8,local_4a8,__destroy_functor);
    }
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)ppuVar16;
    LogicalType::~LogicalType(local_4a0);
    SimpleFunction::~SimpleFunction((SimpleFunction *)&local_158);
    local_298.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)bind_lambda;
    if (local_298.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_298.function_info.internal.
                 super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_298.function.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_298.function.super__Function_base._M_manager)(local_4b0,local_4b0,__destroy_functor);
    }
    local_298.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)ppuVar16;
    LogicalType::~LogicalType(other);
    SimpleFunction::~SimpleFunction((SimpleFunction *)&local_298);
    Value::~Value((Value *)local_328);
    LogicalType::~LogicalType(&local_340);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_390);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_498);
    lVar12 = local_430 + 0xc1;
  } while (lVar12 != 0x99cc);
  paVar2 = &local_2d0.super_FunctionSet<duckdb::ScalarFunction>.name.field_2;
  paVar1 = &local_510.super_FunctionSet<duckdb::ScalarFunction>.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p == paVar1) {
    local_2d0.super_FunctionSet<duckdb::ScalarFunction>.name.field_2._8_8_ =
         local_510.super_FunctionSet<duckdb::ScalarFunction>.name.field_2._8_8_;
    local_2d0.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_2d0.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p =
         local_510.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p;
  }
  local_2d0.super_FunctionSet<duckdb::ScalarFunction>.name._M_string_length =
       local_510.super_FunctionSet<duckdb::ScalarFunction>.name._M_string_length;
  local_510.super_FunctionSet<duckdb::ScalarFunction>.name._M_string_length = 0;
  local_510.super_FunctionSet<duckdb::ScalarFunction>.name.field_2._M_local_buf[0] = '\0';
  local_2d0.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
       super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
       super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_2d0.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
       super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
       super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_2d0.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
       super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
       super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_510.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p = (pointer)paVar1;
  AddExtensionFunction(local_4b8,&local_2d0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
            (&local_2d0.super_FunctionSet<duckdb::ScalarFunction>.functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_2d0.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p);
  }
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
            (&local_510.super_FunctionSet<duckdb::ScalarFunction>.functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_510.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BuiltinFunctions::RegisterExtensionOverloads() {
#ifdef GENERATE_EXTENSION_ENTRIES
	// do not insert auto loading placeholders when generating extension entries
	return;
#endif
	ScalarFunctionSet current_set;
	for (auto &entry : EXTENSION_FUNCTION_OVERLOADS) {
		vector<LogicalType> arguments;
		auto splits = StringUtil::Split(entry.signature, ">");
		auto return_type = DBConfig::ParseLogicalType(splits[1]);
		auto parameters = Value(splits[0]).DefaultCastAs(LogicalType::LIST(LogicalType::VARCHAR));
		for (auto &param : ListValue::GetChildren(parameters)) {
			arguments.push_back(DBConfig::ParseLogicalType(param.GetValue<string>()));
		}
		if (entry.type != CatalogType::SCALAR_FUNCTION_ENTRY) {
			throw InternalException(
			    "Extension function overloads only supported for scalar functions currently - %s has a different type",
			    entry.name);
		}

		ScalarFunction function(entry.name, std::move(arguments), std::move(return_type), nullptr,
		                        BindExtensionFunction);
		function.function_info = make_shared_ptr<ExtensionFunctionInfo>(entry.extension);
		if (current_set.name != entry.name) {
			if (!current_set.name.empty()) {
				// create set of functions
				AddExtensionFunction(current_set);
			}
			current_set = ScalarFunctionSet(entry.name);
		}
		// add this function to the set of function overloads
		current_set.AddFunction(std::move(function));
	}
	AddExtensionFunction(std::move(current_set));
}